

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_randomness(int N,void *pBuf)

{
  long lVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs *psVar4;
  long lVar5;
  uint uVar6;
  u32 uVar7;
  undefined8 in_RCX;
  u32 uVar8;
  uint uVar9;
  u32 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  u32 uVar16;
  uint uVar17;
  u32 uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  u32 uVar23;
  uint uVar24;
  uint uVar25;
  u32 uVar26;
  u32 local_a4;
  u32 local_a0;
  int local_9c;
  u32 local_98;
  uint uStack_94;
  u32 uStack_90;
  uint auStack_8c [3];
  u32 uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  sqlite3_mutex *local_50;
  undefined4 local_44;
  u32 local_40;
  int local_3c;
  void *local_38;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return;
  }
  if (sqlite3Config.bCoreMutex == '\0') {
    if (N < 1 || pBuf == (void *)0x0) {
LAB_0011856e:
      sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
      return;
    }
    local_44 = 1;
    local_50 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(5);
    if (psVar3 == (sqlite3_mutex *)0x0) {
      local_50 = psVar3;
      local_44 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),psVar3 == (sqlite3_mutex *)0x0);
      if (pBuf == (void *)0x0 || N < 1) goto LAB_0011856e;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(psVar3);
      if (pBuf == (void *)0x0 || N < 1) {
        sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
        goto LAB_0011892c;
      }
      local_50 = psVar3;
      local_44 = 0;
    }
  }
  if (sqlite3Prng.s[0] == 0) {
    uVar23 = 0;
    psVar4 = sqlite3_vfs_find((char *)0x0);
    sqlite3Prng.s[0] = 0x61707865;
    sqlite3Prng.s[1] = 0x3320646e;
    sqlite3Prng.s[2] = 0x79622d32;
    sqlite3Prng.s[3] = 0x6b206574;
    if (psVar4 == (sqlite3_vfs *)0x0) {
      sqlite3Prng.s[0xd] = 0;
      sqlite3Prng.s[0xe] = 0;
      sqlite3Prng.s[8] = 0;
      sqlite3Prng.s[9] = 0;
      sqlite3Prng.s[10] = 0;
      sqlite3Prng.s[0xb] = 0;
      sqlite3Prng.s[4] = 0;
      sqlite3Prng.s[5] = 0;
      sqlite3Prng.s[6] = 0;
      sqlite3Prng.s[7] = 0;
    }
    else if (sqlite3Config.iPrngSeed == 0) {
      (*psVar4->xRandomness)(psVar4,0x2c,(char *)(sqlite3Prng.s + 4));
      uVar23 = sqlite3Prng.s[0xc];
    }
    else {
      sqlite3Prng.s[9] = 0;
      sqlite3Prng.s[10] = 0;
      sqlite3Prng.s[0xb] = 0;
      sqlite3Prng.s[5] = 0;
      sqlite3Prng.s[6] = 0;
      sqlite3Prng.s[7] = 0;
      sqlite3Prng.s[8] = 0;
      sqlite3Prng.s[0xd] = 0;
      sqlite3Prng.s[0xe] = 0;
      sqlite3Prng.s[4] = sqlite3Config.iPrngSeed;
      uVar23 = 0;
    }
    sqlite3Prng.s[0xc] = 0;
    sqlite3Prng.n = '\0';
    sqlite3Prng.s[0xf] = uVar23;
  }
  uVar20 = (uint)sqlite3Prng.n;
  local_9c = N;
  if ((uint)sqlite3Prng.n < (uint)N) {
    do {
      if (sqlite3Prng.n != '\0') {
        memcpy(pBuf,sqlite3Prng.out,(ulong)sqlite3Prng.n);
        local_9c = local_9c - (uint)sqlite3Prng.n;
        pBuf = (void *)((long)pBuf + (ulong)(uint)sqlite3Prng.n);
      }
      sqlite3Prng.s[0xc] = sqlite3Prng.s[0xc] + 1;
      local_98 = sqlite3Prng.s[0];
      uStack_94 = sqlite3Prng.s[1];
      local_a0 = uStack_94;
      local_a4 = sqlite3Prng.s[9];
      uStack_80 = sqlite3Prng.s[6];
      uStack_90 = sqlite3Prng.s[2];
      uStack_7c = sqlite3Prng.s[7];
      auStack_8c[0] = sqlite3Prng.s[3];
      auStack_8c[1] = sqlite3Prng.s[4];
      auStack_8c[2] = sqlite3Prng.s[5];
      uVar23 = sqlite3Prng.s[0xc];
      uVar8 = sqlite3Prng.s[0xd];
      uVar7 = sqlite3Prng.s[8];
      uVar16 = sqlite3Prng.s[0xe];
      uVar18 = sqlite3Prng.s[10];
      uVar26 = sqlite3Prng.s[0xf];
      uVar10 = sqlite3Prng.s[0xb];
      iVar2 = 10;
      do {
        local_3c = iVar2;
        local_40 = uStack_90;
        uVar20 = uVar23 ^ local_98 + auStack_8c[1];
        uVar21 = uVar20 << 0x10 | uVar20 >> 0x10;
        uVar6 = uVar7 + uVar21;
        uVar20 = auStack_8c[1] ^ uVar6;
        uVar20 = uVar20 << 0xc | uVar20 >> 0x14;
        uVar9 = local_98 + auStack_8c[1] + uVar20;
        uVar21 = uVar21 ^ uVar9;
        uVar22 = uVar21 << 8 | uVar21 >> 0x18;
        uVar6 = uVar6 + uVar22;
        uVar20 = uVar20 ^ uVar6;
        uVar11 = uVar20 << 7 | uVar20 >> 0x19;
        uVar20 = uVar8 ^ local_a0 + auStack_8c[2];
        uVar21 = uVar20 << 0x10 | uVar20 >> 0x10;
        local_a4 = local_a4 + uVar21;
        uVar20 = auStack_8c[2] ^ local_a4;
        uVar20 = uVar20 << 0xc | uVar20 >> 0x14;
        local_a0 = local_a0 + auStack_8c[2] + uVar20;
        uVar21 = uVar21 ^ local_a0;
        uVar21 = uVar21 << 8 | uVar21 >> 0x18;
        local_a4 = local_a4 + uVar21;
        uVar20 = uVar20 ^ local_a4;
        uVar20 = uVar20 << 7 | uVar20 >> 0x19;
        uVar13 = uVar16 ^ local_40 + uStack_80;
        uVar14 = uVar13 << 0x10 | uVar13 >> 0x10;
        uVar17 = uVar18 + uVar14;
        uVar13 = uStack_80 ^ uVar17;
        uVar13 = uVar13 << 0xc | uVar13 >> 0x14;
        uVar12 = local_40 + uStack_80 + uVar13;
        uVar14 = uVar14 ^ uVar12;
        uVar15 = uVar14 << 8 | uVar14 >> 0x18;
        uVar17 = uVar17 + uVar15;
        uVar13 = uVar13 ^ uVar17;
        uVar14 = uVar13 << 7 | uVar13 >> 0x19;
        uVar13 = uVar26 ^ auStack_8c[0] + uStack_7c;
        uVar25 = uVar13 << 0x10 | uVar13 >> 0x10;
        uVar13 = uVar10 + uVar25;
        uVar19 = uStack_7c ^ uVar13;
        uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
        uVar24 = auStack_8c[0] + uStack_7c + uVar19;
        uVar25 = uVar25 ^ uVar24;
        uVar25 = uVar25 << 8 | uVar25 >> 0x18;
        uVar13 = uVar13 + uVar25;
        uVar19 = uVar19 ^ uVar13;
        uVar19 = uVar19 << 7 | uVar19 >> 0x19;
        uVar9 = uVar9 + uVar20;
        uVar25 = uVar25 ^ uVar9;
        uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
        uVar17 = uVar17 + uVar25;
        uVar20 = uVar20 ^ uVar17;
        uVar20 = uVar20 << 0xc | uVar20 >> 0x14;
        local_98 = uVar9 + uVar20;
        uVar25 = uVar25 ^ local_98;
        uVar26 = uVar25 << 8 | uVar25 >> 0x18;
        uVar18 = uVar17 + uVar26;
        uVar20 = uVar20 ^ uVar18;
        auStack_8c[2] = uVar20 << 7 | uVar20 >> 0x19;
        local_a0 = local_a0 + uVar14;
        uVar22 = uVar22 ^ local_a0;
        uVar9 = uVar22 << 0x10 | uVar22 >> 0x10;
        uVar13 = uVar13 + uVar9;
        uVar14 = uVar14 ^ uVar13;
        uVar20 = uVar14 << 0xc | uVar14 >> 0x14;
        local_a0 = local_a0 + uVar20;
        uVar9 = uVar9 ^ local_a0;
        uVar23 = uVar9 << 8 | uVar9 >> 0x18;
        uVar10 = uVar13 + uVar23;
        uVar20 = uVar20 ^ uVar10;
        uStack_80 = uVar20 << 7 | uVar20 >> 0x19;
        uVar12 = uVar12 + uVar19;
        uVar21 = uVar21 ^ uVar12;
        uVar20 = uVar21 << 0x10 | uVar21 >> 0x10;
        uVar6 = uVar6 + uVar20;
        uVar19 = uVar19 ^ uVar6;
        uVar21 = uVar19 << 0xc | uVar19 >> 0x14;
        uStack_90 = uVar12 + uVar21;
        uVar20 = uVar20 ^ uStack_90;
        uVar8 = uVar20 << 8 | uVar20 >> 0x18;
        uVar7 = uVar6 + uVar8;
        uVar21 = uVar21 ^ uVar7;
        uStack_7c = uVar21 << 7 | uVar21 >> 0x19;
        uVar24 = uVar24 + uVar11;
        uVar15 = uVar15 ^ uVar24;
        uVar6 = uVar15 << 0x10 | uVar15 >> 0x10;
        local_a4 = local_a4 + uVar6;
        uVar11 = uVar11 ^ local_a4;
        uVar20 = uVar11 << 0xc | uVar11 >> 0x14;
        auStack_8c[0] = uVar24 + uVar20;
        uVar6 = uVar6 ^ auStack_8c[0];
        uVar16 = uVar6 << 8 | uVar6 >> 0x18;
        local_a4 = local_a4 + uVar16;
        uVar20 = uVar20 ^ local_a4;
        auStack_8c[1] = uVar20 << 7 | uVar20 >> 0x19;
        iVar2 = local_3c + -1;
      } while (local_3c + -1 != 0);
      _local_98 = CONCAT44(local_a0,local_98);
      _local_68 = CONCAT44(uVar8,uVar23);
      _local_78 = CONCAT44(local_a4,uVar7);
      _uStack_60 = CONCAT44(uVar26,uVar16);
      _uStack_70 = CONCAT44(uVar10,uVar18);
      lVar5 = 0;
      do {
        uVar23 = sqlite3Prng.s[lVar5 + 1];
        uVar8 = sqlite3Prng.s[lVar5 + 2];
        uVar7 = sqlite3Prng.s[lVar5 + 3];
        uVar20 = (&uStack_94)[lVar5];
        uVar6 = auStack_8c[lVar5 + -1];
        uVar21 = auStack_8c[lVar5];
        lVar1 = lVar5 * 4;
        *(u32 *)(sqlite3Prng.out + lVar1) = sqlite3Prng.s[lVar5] + (&local_98)[lVar5];
        *(u32 *)(sqlite3Prng.out + lVar1 + 4) = uVar23 + uVar20;
        *(u32 *)(sqlite3Prng.out + lVar1 + 8) = uVar8 + uVar6;
        *(u32 *)(sqlite3Prng.out + lVar1 + 0xc) = uVar7 + uVar21;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      sqlite3Prng.n = '@';
      local_38 = pBuf;
    } while (0x40 < local_9c);
    uVar20 = 0x40;
    N = local_9c;
  }
  memcpy(pBuf,sqlite3Prng.out + (int)(uVar20 - N),(long)N);
  sqlite3Prng.n = sqlite3Prng.n - (char)N;
  psVar3 = local_50;
  if ((char)local_44 != '\0') {
    return;
  }
LAB_0011892c:
  (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.s[0] = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.
  */
  if( wsdPrng.s[0]==0 ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    static const u32 chacha20_init[] = {
      0x61707865, 0x3320646e, 0x79622d32, 0x6b206574
    };
    memcpy(&wsdPrng.s[0], chacha20_init, 16);
    if( NEVER(pVfs==0) ){
      memset(&wsdPrng.s[4], 0, 44);
    }else{
      sqlite3OsRandomness(pVfs, 44, (char*)&wsdPrng.s[4]);
    }
    wsdPrng.s[15] = wsdPrng.s[12];
    wsdPrng.s[12] = 0;
    wsdPrng.n = 0;
  }

  assert( N>0 );
  while( 1 /* exit by break */ ){
    if( N<=wsdPrng.n ){
      memcpy(zBuf, &wsdPrng.out[wsdPrng.n-N], N);
      wsdPrng.n -= N;
      break;
    }
    if( wsdPrng.n>0 ){
      memcpy(zBuf, wsdPrng.out, wsdPrng.n);
      N -= wsdPrng.n;
      zBuf += wsdPrng.n;
    }
    wsdPrng.s[12]++;
    chacha_block((u32*)wsdPrng.out, wsdPrng.s);
    wsdPrng.n = 64;
  }
  sqlite3_mutex_leave(mutex);
}